

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcOpenShell,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcConnectedFaceSet *this;
  
  this = (IfcConnectedFaceSet *)operator_new(0x70);
  *(undefined ***)&this->field_0x58 = &PTR__Object_008ee2a0;
  this[1].super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)0x0;
  *(char **)&this[1].super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
             super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x8 =
       "IfcOpenShell";
  Assimp::IFC::Schema_2x3::IfcConnectedFaceSet::IfcConnectedFaceSet
            (this,&PTR_construction_vtable_24__00931f70);
  (this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcOpenShell_00931eb8;
  *(undefined ***)&this->field_0x58 = &PTR__IfcOpenShell_00931f58;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcOpenShell_00931ee0;
  *(undefined ***)
   &(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcOpenShell_00931f08;
  *(undefined ***)&this->field_0x48 = &PTR__IfcOpenShell_00931f30;
  GenericFill<Assimp::IFC::Schema_2x3::IfcConnectedFaceSet>(db,params,this);
  return (Object *)
         ((long)&(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(this->super_IfcTopologicalRepresentationItem).super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }